

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O0

void cp_decl_msvcattribute(CPState *cp,CPDecl *decl)

{
  long lVar1;
  int iVar2;
  long in_RDI;
  GCstr *attrstr;
  undefined4 in_stack_ffffffffffffffd8;
  CPToken in_stack_ffffffffffffffdc;
  uint7 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  
  cp_next((CPState *)0x1aefb8);
  cp_check((CPState *)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0),
           in_stack_ffffffffffffffdc);
  while (*(int *)(in_RDI + 4) == 0x100) {
    lVar1 = *(long *)(in_RDI + 0x10);
    cp_next((CPState *)0x1aeff1);
    if ((*(int *)(lVar1 + 0xc) == 5) &&
       (iVar2 = memcmp((void *)(lVar1 + 0x10),"align",5), iVar2 == 0)) {
      cp_decl_align((CPState *)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0),
                    (CPDecl *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    }
    else {
      iVar2 = cp_opt((CPState *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),0);
      if (iVar2 != 0) {
        while( true ) {
          in_stack_ffffffffffffffe7 = false;
          if (*(int *)(in_RDI + 4) != 0x29) {
            in_stack_ffffffffffffffe7 = *(int *)(in_RDI + 4) != 0x103;
          }
          if ((bool)in_stack_ffffffffffffffe7 == false) break;
          cp_next((CPState *)0x1af07d);
        }
        cp_check((CPState *)(ulong)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
      }
    }
  }
  cp_check((CPState *)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0),
           in_stack_ffffffffffffffdc);
  return;
}

Assistant:

static void cp_decl_msvcattribute(CPState *cp, CPDecl *decl)
{
  cp_next(cp);
  cp_check(cp, '(');
  while (cp->tok == CTOK_IDENT) {
    GCstr *attrstr = cp->str;
    cp_next(cp);
    if (cp_str_is(attrstr, "align")) {
      cp_decl_align(cp, decl);
    } else {  /* Ignore all other attributes. */
      if (cp_opt(cp, '(')) {
	while (cp->tok != ')' && cp->tok != CTOK_EOF) cp_next(cp);
	cp_check(cp, ')');
      }
    }
  }
  cp_check(cp, ')');
}